

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O1

KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
::get(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_void>
      *this,uint index)

{
  long lVar1;
  undefined8 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint in_EDX;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> extraout_RDX;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> extraout_RDX_00;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> extraout_RDX_01;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> _Var3;
  pointer *__ptr;
  undefined4 in_register_00000034;
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_> KVar4;
  long *local_78;
  string local_70;
  path local_50;
  
  lVar1 = *(long *)((SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,unsigned_int,void>
                     *)CONCAT44(in_register_00000034,index) + 0x20);
  puVar2 = *(undefined8 **)(lVar1 + 0x20);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x28);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,unsigned_int,void>
  ::getStorageFilePath_abi_cxx11_
            (&local_70,
             (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,supermap::ByteArray<4ul>>,unsigned_int,void>
              *)CONCAT44(in_register_00000034,index));
  std::filesystem::__cxx11::path::path(&local_50,&local_70,auto_format);
  (**(code **)*puVar2)(&local_78,puVar2,&local_50,(ulong)in_EDX * 6);
  io::
  InputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_6UL,_void>
  ::next((InputIterator<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<4UL>_>,_unsigned_int,_6UL,_void>
          *)this);
  if (local_78 != (long *)0x0) {
    (**(code **)(*local_78 + 0x18))();
  }
  std::filesystem::__cxx11::path::~path(&local_50);
  _Var3._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       extraout_RDX.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
       .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    _Var3._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         extraout_RDX_00.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var3._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         extraout_RDX_01._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  }
  KVar4.value.data_._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
  ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
       _Var3._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  KVar4._0_8_ = this;
  return KVar4;
}

Assistant:

[[nodiscard]] T get(IndexT index) const override {
        assert(index < getItemsCount());
        return getFileManager()->template getInputIterator<T, IndexT>(
            getStorageFilePath(),
            index * io::FixedDeserializedSizeRegister<T>::exactDeserializedSize
        ).next();
    }